

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall
test_cross_entropy_loss::build_graph(test_cross_entropy_loss *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"logits");
  pgVar2 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_name(pgVar2,"labels");
  uVar3 = ggml_soft_max(ctx,pgVar2);
  ggml_set_name(uVar3,"labels_normalized");
  pgVar1 = (ggml_tensor *)ggml_cross_entropy_loss(ctx,pgVar1,uVar3);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * logits = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, logits);
        ggml_set_name(logits, "logits");

        ggml_tensor * labels = ggml_new_tensor(ctx, type, 4, ne.data());
        // The labels are assumed to be constant -> no gradients.
        ggml_set_name(labels, "labels");

        // Ensure labels add up to 1:
        labels = ggml_soft_max(ctx, labels);
        ggml_set_name(labels, "labels_normalized");

        ggml_tensor * out = ggml_cross_entropy_loss(ctx, logits, labels);
        ggml_set_name(out, "out");

        return out;
    }